

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::AbstractTransaction::GetTotalSize(AbstractTransaction *this)

{
  uint uVar1;
  CfdException *this_00;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  int local_28;
  uint local_24;
  int ret;
  uint32_t flag;
  wally_tx *tx_pointer;
  size_t length;
  AbstractTransaction *this_local;
  
  tx_pointer = (wally_tx *)0x0;
  _ret = this->wally_tx_pointer_;
  local_24 = 0;
  length = (size_t)this;
  uVar1 = (*this->_vptr_AbstractTransaction[7])();
  if ((uVar1 & 1) != 0) {
    local_24 = (*this->_vptr_AbstractTransaction[9])();
    local_24 = local_24 & 1;
  }
  local_28 = wally_tx_get_length(_ret,local_24,&tx_pointer);
  if (local_28 == 0) {
    return (uint32_t)tx_pointer;
  }
  local_40.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_transaction_common.cpp"
               ,0x2f);
  local_40.filename = local_40.filename + 1;
  local_40.line = 0x23c;
  local_40.funcname = "GetTotalSize";
  logger::warn<int&>(&local_40,"wally_tx_get_length NG[{}].",&local_28);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_60,"transaction size calc error.",&local_61);
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_60);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t AbstractTransaction::GetTotalSize() const {
  size_t length = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  uint32_t flag = 0;
  if (HasWitness()) {
    flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
  }
  int ret = wally_tx_get_length(tx_pointer, flag, &length);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "transaction size calc error.");
  }
  return static_cast<uint32_t>(length);
}